

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int prune_zero_mv_with_sse
              (aom_variance_fn_ptr_t *fn_ptr,MACROBLOCK *x,BLOCK_SIZE bsize,
              HandleInterModeArgs *args,int prune_zero_mv_with_sse)

{
  long in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double mul;
  uint best_sse;
  uint this_sse;
  int ref_stride;
  int src_stride;
  uint8_t *ref;
  uint8_t *src;
  buf_2d *ref_buf;
  buf_2d *src_buf;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int idx_1;
  uint best_sse_sum;
  uint this_sse_sum;
  int idx;
  MV_REFERENCE_FRAME *refs;
  int is_comp_pred;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  long local_70;
  long local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  MV_REFERENCE_FRAME *local_50;
  int local_44;
  MB_MODE_INFO *local_40;
  long local_38;
  int local_2c;
  long local_28;
  byte local_19;
  long local_18;
  long local_10;
  uint local_4;
  
  local_38 = in_RSI + 0x1a0;
  local_40 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_44 = has_second_ref(local_40);
  local_50 = local_40->ref_frame;
  local_54 = 0;
  while( true ) {
    if (local_44 + 1 <= local_54) {
      local_58 = 0;
      local_5c = 0;
      for (local_60 = 0; local_60 < local_44 + 1; local_60 = local_60 + 1) {
        local_68 = local_18;
        local_70 = local_38 + 0x10;
        local_78 = (undefined8 *)(local_18 + 0x30);
        local_80 = (undefined8 *)(local_38 + 0x40 + (long)local_60 * 0x20);
        local_88 = *local_78;
        local_90 = *local_80;
        local_94 = *(undefined4 *)(local_18 + 0x48);
        local_98 = *(undefined4 *)(local_80 + 3);
        (**(code **)(local_10 + (ulong)local_19 * 0x70 + 0x18))
                  (local_90,local_98,local_88,local_94,&local_9c);
        local_58 = local_9c + local_58;
        local_5c = *(int *)(local_28 + 0x152c + (long)local_50[local_60] * 4) + local_5c;
      }
      local_4 = (uint)(*(double *)(&DAT_00ba78a0 + (ulong)(1 < local_2c) * 8) * (double)local_5c <
                      (double)local_58);
      return local_4;
    }
    if (*(char *)(*(long *)(local_38 + 0x29f8) + (long)local_50[local_54] * 0x24 + 0x20) != '\0')
    break;
    if (*(int *)(local_28 + 0x152c + (long)local_50[local_54] * 4) == 0x7fffffff) {
      return 0;
    }
    local_54 = local_54 + 1;
  }
  return 0;
}

Assistant:

static inline int prune_zero_mv_with_sse(const aom_variance_fn_ptr_t *fn_ptr,
                                         const MACROBLOCK *x, BLOCK_SIZE bsize,
                                         const HandleInterModeArgs *args,
                                         int prune_zero_mv_with_sse) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];

  const int is_comp_pred = has_second_ref(mbmi);
  const MV_REFERENCE_FRAME *refs = mbmi->ref_frame;

  for (int idx = 0; idx < 1 + is_comp_pred; idx++) {
    if (xd->global_motion[refs[idx]].wmtype != IDENTITY) {
      // Pruning logic only works for IDENTITY type models
      // Note: In theory we could apply similar logic for TRANSLATION
      // type models, but we do not code these due to a spec bug
      // (see comments in gm_get_motion_vector() in av1/common/mv.h)
      assert(xd->global_motion[refs[idx]].wmtype != TRANSLATION);
      return 0;
    }

    // Don't prune if we have invalid data
    assert(mbmi->mv[idx].as_int == 0);
    if (args->best_single_sse_in_refs[refs[idx]] == INT32_MAX) {
      return 0;
    }
  }

  // Sum up the sse of ZEROMV and best NEWMV
  unsigned int this_sse_sum = 0;
  unsigned int best_sse_sum = 0;
  for (int idx = 0; idx < 1 + is_comp_pred; idx++) {
    const struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
    const struct macroblockd_plane *pd = xd->plane;
    const struct buf_2d *src_buf = &p->src;
    const struct buf_2d *ref_buf = &pd->pre[idx];
    const uint8_t *src = src_buf->buf;
    const uint8_t *ref = ref_buf->buf;
    const int src_stride = src_buf->stride;
    const int ref_stride = ref_buf->stride;

    unsigned int this_sse;
    fn_ptr[bsize].vf(ref, ref_stride, src, src_stride, &this_sse);
    this_sse_sum += this_sse;

    const unsigned int best_sse = args->best_single_sse_in_refs[refs[idx]];
    best_sse_sum += best_sse;
  }

  const double mul = prune_zero_mv_with_sse > 1 ? 1.00 : 1.25;
  if ((double)this_sse_sum > (mul * (double)best_sse_sum)) {
    return 1;
  }

  return 0;
}